

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_1bc0bf::testWriteRead(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  char *__filename;
  int i;
  string levelModeName;
  string typeNames [2];
  string fn;
  string *in_stack_00000300;
  string *in_stack_00000480;
  string *local_150;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string *local_a8;
  int local_8c;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_a8 = local_68;
  do {
    std::__cxx11::string::string(local_a8);
    local_a8 = local_a8 + 0x20;
  } while (local_a8 != local_28);
  std::__cxx11::string::string(local_88);
  for (local_8c = 0; local_8c < 2; local_8c = local_8c + 1) {
    iVar1 = *(int *)((long)&(anonymous_namespace)::pixelTypes + (long)local_8c * 4);
    if (iVar1 == 0) {
      std::__cxx11::string::operator=(local_68 + (long)local_8c * 0x20,"unsigned int");
    }
    else if (iVar1 == 1) {
      std::__cxx11::string::operator=(local_68 + (long)local_8c * 0x20,"float");
    }
    else if (iVar1 == 2) {
      std::__cxx11::string::operator=(local_68 + (long)local_8c * 0x20,"half");
    }
    if ((anonymous_namespace)::levelMode == 0) {
      std::__cxx11::string::operator=(local_88,"ONE_LEVEL");
    }
    else if ((anonymous_namespace)::levelMode == 1) {
      std::__cxx11::string::operator=(local_88,"MIPMAP");
    }
    else if ((anonymous_namespace)::levelMode == 2) {
      std::__cxx11::string::operator=(local_88,"RIPMAP");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"part 1: type ");
  poVar2 = std::operator<<(poVar2,local_68);
  poVar2 = std::operator<<(poVar2," tiled part, ");
  poVar2 = std::operator<<(poVar2,"part 2: type ");
  poVar2 = std::operator<<(poVar2,local_48);
  poVar2 = std::operator<<(poVar2," tiled part, ");
  poVar2 = std::operator<<(poVar2,"level mode ");
  poVar2 = std::operator<<(poVar2,local_88);
  poVar2 = std::operator<<(poVar2," tile size ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(anonymous_namespace)::tileSize);
  poVar2 = std::operator<<(poVar2,"x");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(anonymous_namespace)::tileSize);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  generateFiles(in_stack_00000480);
  readFiles(in_stack_00000300);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_88);
  local_150 = local_28;
  do {
    local_150 = local_150 + -0x20;
    std::__cxx11::string::~string(local_150);
  } while (local_150 != local_68);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void
testWriteRead (const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_multi_tiled_part_threading.exr";
    string      typeNames[2];
    string      levelModeName;
    for (int i = 0; i < 2; i++)
    {
        switch (pixelTypes[i])
        {
            case 0: typeNames[i] = "unsigned int"; break;
            case 1: typeNames[i] = "float"; break;
            case 2: typeNames[i] = "half"; break;
        }

        switch (levelMode)
        {
            case 0: levelModeName = "ONE_LEVEL"; break;
            case 1: levelModeName = "MIPMAP"; break;
            case 2: levelModeName = "RIPMAP"; break;
        }
    }
    cout << "part 1: type " << typeNames[0] << " tiled part, "
         << "part 2: type " << typeNames[1] << " tiled part, "
         << "level mode " << levelModeName << " tile size " << tileSize << "x"
         << tileSize << endl
         << flush;

    generateFiles (fn);
    readFiles (fn);

    remove (fn.c_str ());

    cout << endl << flush;
}